

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

char * strprepend(char *s,char *pref)

{
  int iVar1;
  size_t sVar2;
  int i;
  char *pref_local;
  char *s_local;
  
  sVar2 = strlen(pref);
  iVar1 = (int)sVar2;
  if (iVar1 < 0x51) {
    s_local = s + -(long)iVar1;
    strncpy(s_local,pref,(long)iVar1);
  }
  else {
    warning("PREFIX too short (for %d).",sVar2 & 0xffffffff);
    s_local = s;
  }
  return s_local;
}

Assistant:

static char *strprepend(char *s, const char *pref)
{
	int i = (int)strlen(pref);

	if (i > PREFIX) {
		warning("PREFIX too short (for %d).", i);
		return s;
	}
	s -= i;
	strncpy(s, pref, i);	/* do not copy trailing 0 */
	return s;
}